

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char **pointer_local;
  Message *this_local;
  
  if (*pointer == (char *)0x0) {
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->ss_);
    std::operator<<((ostream *)(pbVar1 + 0x10),"(null)");
  }
  else {
    pbVar1 = internal::
             scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->ss_);
    std::operator<<((ostream *)(pbVar1 + 0x10),*pointer);
  }
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      *ss_ << pointer;
    }
    return *this;
  }